

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListExpression.cpp
# Opt level: O3

void __thiscall hdc::ListExpression::~ListExpression(ListExpression *this)

{
  ~ListExpression(this);
  operator_delete(this);
  return;
}

Assistant:

ListExpression::~ListExpression() {
    for (int i = 0; i < expressions.size(); ++i) {
        delete expressions[i];
    }
}